

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_()>::
callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder>::~callable_impl
          (callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder> *this)

{
  ~callable_impl(this);
  operator_delete(this);
  return;
}

Assistant:

callable_impl(F f) : func(f){}